

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

string * clask::html_encode(string *__return_storage_ptr__,string *value)

{
  bool bVar1;
  reference pcVar2;
  char *c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *value_local;
  string *buf;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    switch(*pcVar2) {
    case '\"':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    default:
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar2);
      break;
    case '&':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case '\'':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case '<':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case '>':
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string html_encode(const std::string& value) {
  std::string buf;
  buf.reserve(value.size());
  for (const char & c : value) {
    switch (c) {
      case '&':  buf.append("&amp;");  break;
      case '\"': buf.append("&quot;"); break;
      case '\'': buf.append("&apos;"); break;
      case '<':  buf.append("&lt;");   break;
      case '>':  buf.append("&gt;");   break;
      default:   buf.append(&c, 1); break;
    }
  }
  return buf;
}